

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O2

void fy_emit_token_write_plain(fy_emitter *emit,fy_token *fyt,int flags,int indent)

{
  fy_emit_accum *ea;
  fy_emitter_cfg_flags fVar1;
  fy_emitter_write_type type;
  byte bVar2;
  bool bVar3;
  _Bool _Var4;
  fy_atom_style fVar5;
  fy_emitter_cfg_flags fVar6;
  int c;
  int iVar7;
  int iVar8;
  fy_atom *atom;
  char *str;
  bool bVar9;
  size_t len;
  fy_atom_iter iter;
  
  len = 0;
  if ((fyt != (fy_token *)0x0) ||
     (fVar1 = emit->cfg->flags,
     (fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE)) {
    type = fyewt_plain_scalar_key;
    if ((flags & 0x40U) == 0) {
      type = fyewt_plain_scalar;
    }
    atom = fy_token_atom(fyt);
    fVar1 = emit->cfg->flags;
    if (((fVar1 & 0xe00000) == FYECF_MODE_JSON || (fVar1 & 0xf00000) == FYECF_MODE_JSON_ONELINE) &&
       ((atom == (fy_atom *)0x0 || fyt == (fy_token *)0x0 || ((atom->field_0x36 & 0x10) != 0)))) {
      fy_emit_puts(emit,type,"null");
    }
    else {
      str = fy_token_get_direct_output(fyt,&len);
      if (str != (char *)0x0) {
        fVar5 = fy_token_atom_style(fyt);
        if (fVar5 == FYAS_PLAIN) {
          fy_emit_write(emit,type,str,(int)len);
          goto LAB_00124d44;
        }
      }
      if (atom != (fy_atom *)0x0) {
        if ((flags & 8U) == 0) {
          fVar1 = emit->cfg->flags;
          fVar6 = fVar1 & 0xf00000;
          bVar9 = fVar6 != FYECF_MODE_FLOW_ONELINE &&
                  (fVar6 != FYECF_MODE_JSON_ONELINE && (fVar1 & 0xe00000) != FYECF_MODE_JSON);
        }
        else {
          bVar9 = false;
        }
        fy_atom_iter_start(atom,&iter);
        ea = &emit->ea;
        fy_emit_accum_start(ea,type);
LAB_00124c14:
        bVar3 = false;
        bVar2 = 0;
LAB_00124c1e:
        do {
          c = fy_atom_iter_utf8_get(&iter);
          if (c < 1) {
LAB_00124d06:
            fy_emit_accum_output(ea);
            (emit->ea).next = 0;
            (emit->ea).utf8_count = 0;
            (emit->ea).col = (emit->ea).start_col;
            fy_atom_iter_finish(&iter);
            break;
          }
          if ((c == 0x20) || (c == 9)) {
            if (!(bool)(bVar2 | bVar9 ^ 1U)) {
              iVar8 = (emit->ea).col;
              iVar7 = fy_emit_width(emit);
              if (iVar7 < iVar8) {
                iVar8 = fy_atom_iter_utf8_peek(&iter);
                if ((iVar8 != 9) && (iVar8 != 0x20)) {
                  fy_emit_accum_output(ea);
                  *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
                  fy_emit_write_indent(emit,indent);
                  bVar2 = 1;
                  goto LAB_00124c1e;
                }
              }
            }
            fy_emit_accum_utf8_put(ea,c);
            bVar2 = 1;
            goto LAB_00124c1e;
          }
          _Var4 = fy_is_lb(c);
          if (!_Var4) goto LAB_00124cdf;
          if (!bVar9) goto LAB_00124d06;
          if (!bVar3) {
            fy_emit_accum_output(ea);
            fy_emit_write_indent(emit,indent);
          }
          *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
          fy_emit_write_indent(emit,indent);
          bVar3 = true;
        } while( true );
      }
    }
  }
LAB_00124d44:
  *(byte *)&emit->flags = (byte)emit->flags & 0xfc;
  return;
LAB_00124cdf:
  if (bVar3) {
    fy_emit_write_indent(emit,indent);
  }
  fy_emit_accum_utf8_put(ea,c);
  *(byte *)&emit->flags = (byte)emit->flags & 0xfd;
  goto LAB_00124c14;
}

Assistant:

void fy_emit_token_write_plain(struct fy_emitter *emit, struct fy_token *fyt, int flags, int indent) {
    bool allow_breaks, should_indent, spaces, breaks;
    int c;
    enum fy_emitter_write_type wtype;
    const char *str = NULL;
    size_t len = 0;
    struct fy_atom *atom;
    struct fy_atom_iter iter;

    /* null and not json mode */
    if (!fyt && !fy_emit_is_json_mode(emit))
        goto out;

    wtype = (flags & DDNF_SIMPLE_SCALAR_KEY) ? fyewt_plain_scalar_key : fyewt_plain_scalar;

    atom = fy_token_atom(fyt);

    /* null and json mode */
    if (fy_emit_is_json_mode(emit) && (!fyt || !atom || atom->size0)) {
        fy_emit_puts(emit, wtype, "null");
        goto out;
    }

    /* simple case first (90% of cases) */
    str = fy_token_get_direct_output(fyt, &len);
    if (str && fy_token_atom_style(fyt) == FYAS_PLAIN) {
        fy_emit_write(emit, wtype, str, len);
        goto out;
    }

    if (!atom)
        goto out;

    allow_breaks = !(flags & DDNF_SIMPLE) && !fy_emit_is_json_mode(emit) && !fy_emit_is_oneline(emit);

    spaces = false;
    breaks = false;

    fy_atom_iter_start(atom, &iter);
    fy_emit_accum_start(&emit->ea, wtype);
    while ((c = fy_atom_iter_utf8_get(&iter)) > 0) {

        if (fy_is_ws(c)) {

            should_indent = allow_breaks && !spaces &&
                            fy_emit_accum_column(&emit->ea) > fy_emit_width(emit);

            if (should_indent && !fy_is_ws(fy_atom_iter_utf8_peek(&iter))) {
                fy_emit_accum_output(&emit->ea);
                emit->flags &= ~FYEF_INDENTATION;
                fy_emit_write_indent(emit, indent);
            } else
                fy_emit_accum_utf8_put(&emit->ea, c);

            spaces = true;

        } else if (fy_is_lb(c)) {

            /* blergh */
            if (!allow_breaks)
                break;

            /* output run */
            if (!breaks) {
                fy_emit_accum_output(&emit->ea);
                fy_emit_write_indent(emit, indent);
            }

            emit->flags &= ~FYEF_INDENTATION;
            fy_emit_write_indent(emit, indent);

            breaks = true;

        } else {

            if (breaks)
                fy_emit_write_indent(emit, indent);

            fy_emit_accum_utf8_put(&emit->ea, c);

            emit->flags &= ~FYEF_INDENTATION;

            spaces = false;
            breaks = false;
        }
    }
    fy_emit_accum_output(&emit->ea);
    fy_emit_accum_finish(&emit->ea);
    fy_atom_iter_finish(&iter);

    out:
    emit->flags &= ~(FYEF_WHITESPACE | FYEF_INDENTATION);
}